

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager_test.cpp
# Opt level: O2

void __thiscall
JobManagerTestSuite_BuildFinalResultString_Test::~JobManagerTestSuite_BuildFinalResultString_Test
          (JobManagerTestSuite_BuildFinalResultString_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(JobManagerTestSuite, BuildFinalResultString)
{
    TestContext ctx;
    SetInitialExpectations(ctx);

    // Formally set default PSKc
    ctx.mConf.mPSKc = {'1', '0'};

    using namespace ot::commissioner::persistent_storage;
    // Prepare test data
    NetworkId      nid;
    BorderRouterId rid;

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan1", 1, 1, 0x1, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan2", 2, 2, 0x2, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20002, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan3", 3, 3, 0x3, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 2);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20003, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 2);

    Init(ctx, ".");

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[3] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};

    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(3)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[0], IsActive()).WillOnce(Return(false)).WillRepeatedly(Return(true));
    EXPECT_CALL(*commissionerAppMocks[1], IsActive()).WillOnce(Return(false)).WillRepeatedly(Return(true));
    EXPECT_CALL(*commissionerAppMocks[2], IsActive()).WillRepeatedly(Return(false));

    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"start"}, {0x1, 0x02, 0x03}, false).mCode, ErrorCode::kNone);

    EXPECT_CALL(*commissionerAppMocks[0], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[1], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[2], Start(_, _, _))
        .Times(1)
        .WillOnce(Return(Error{ErrorCode::kAborted, "Aborted"}));

    ctx.mJobManager.RunJobs();

    Interpreter::Value value = ctx.mJobManager.CollectJobsValue();
    nlohmann::json     json  = nlohmann::json::parse(value.ToString());

    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_FALSE(json.contains("0x0000000000000003"));
    ctx.mJobManager.CleanupJobs();

    // "active" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"active"}, {0x1, 0x2, 0x3}, false).mCode, ErrorCode::kNone);
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json.contains("0x0000000000000003"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    EXPECT_FALSE(json["0x0000000000000003"]);
    ctx.mJobManager.CleanupJobs();

    // "sessionid" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"sessionid"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([](uint16_t &a) { a = 0; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([](uint16_t &a) { a = 1; }), Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_EQ(json["0x0000000000000001"], 0);
    EXPECT_EQ(json["0x0000000000000002"], 1);
    ctx.mJobManager.CleanupJobs();

    // "opdataset get active" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"opdataset", "get", "active"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], GetActiveDataset(_, _))
        .WillOnce(DoAll(WithArgs<0>([](ActiveOperationalDataset &ods) {
                            ods.mPanId        = 1;
                            ods.mPresentFlags = ActiveOperationalDataset::kPanIdBit;
                        }),
                        Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], GetActiveDataset(_, _))
        .WillOnce(DoAll(WithArgs<0>([](ActiveOperationalDataset &ods) {
                            ods.mPanId        = 2;
                            ods.mPresentFlags = ActiveOperationalDataset::kPanIdBit;
                        }),
                        Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"].contains("PanId"));
    EXPECT_TRUE(json["0x0000000000000002"].contains("PanId"));
    EXPECT_STREQ("0x0001", json["0x0000000000000001"]["PanId"].get<std::string>().c_str());
    EXPECT_STREQ("0x0002", json["0x0000000000000002"]["PanId"].get<std::string>().c_str());
    ctx.mJobManager.CleanupJobs();

    // "opdataset set securitypolicy" command
    SecurityPolicy policies[2];
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"opdataset", "set", "securitypolicy", "3", "AB"}, {0x1, 0x2}, false).mCode,
              ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], SetSecurityPolicy(_))
        .WillOnce(DoAll(WithArgs<0>([&policies](const SecurityPolicy &pol) { policies[0] = pol; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], SetSecurityPolicy(_))
        .WillOnce(DoAll(WithArgs<0>([&policies](const SecurityPolicy &pol) { policies[1] = pol; }), Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    ctx.mJobManager.CleanupJobs();

    // "stop" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"stop"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], Stop());
    EXPECT_CALL(*commissionerAppMocks[1], Stop());
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    ctx.mJobManager.CleanupJobs();
}